

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

int anon_unknown.dwarf_7315::RtMidi_getcompiledapibyname(lua_State *L)

{
  size_t sVar1;
  Api AVar2;
  char *pcVar3;
  allocator local_41;
  string local_40;
  char *local_20;
  char *str;
  size_t sz;
  lua_State *L_local;
  
  sz = (size_t)L;
  pcVar3 = (char *)luaL_checklstring(L,1,&str);
  sVar1 = sz;
  local_20 = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar3,(ulong)str,&local_41);
  AVar2 = RtMidi::getCompiledApiByName(&local_40);
  lua_pushinteger(sVar1,AVar2);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return 1;
}

Assistant:

int RtMidi_getcompiledapibyname(lua_State *L) {
	std::size_t sz;
	const char *str = luaL_checklstring(L, 1, &sz);
	lua_pushinteger(L, RtMidi::getCompiledApiByName({str, sz}));
	return 1;
}